

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

ON_SubD * ON_SubD::CreateSubDBox
                    (ON_3dPoint *corners,ON_SubDEdgeTag edge_tag,uint facecount_x,uint facecount_y,
                    uint facecount_z,ON_SubD *destination_subd)

{
  ON_SubD *pOVar1;
  undefined8 local_38;
  double edge_sharpness;
  ON_SubD *destination_subd_local;
  uint facecount_z_local;
  uint facecount_y_local;
  uint facecount_x_local;
  ON_SubDEdgeTag edge_tag_local;
  ON_3dPoint *corners_local;
  
  if (edge_tag == Crease) {
    local_38 = 5.0;
  }
  else {
    local_38 = 0.0;
  }
  pOVar1 = CreateSubDBox(corners,local_38,facecount_x,facecount_y,facecount_z,destination_subd);
  return pOVar1;
}

Assistant:

ON_SubD* ON_SubD::CreateSubDBox(
  const ON_3dPoint corners[8],
  ON_SubDEdgeTag edge_tag,
  unsigned int facecount_x,
  unsigned int facecount_y,
  unsigned int facecount_z,
  ON_SubD* destination_subd)
{
  double edge_sharpness
    = ON_SubDEdgeTag::Crease == edge_tag
    ? ON_SubDEdgeSharpness::CreaseValue
    : ON_SubDEdgeSharpness::SmoothValue
    ;

  return ON_SubD::CreateSubDBox(
    corners,
    edge_sharpness,
    facecount_x,
    facecount_y,
    facecount_z,
    destination_subd
  );
}